

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O2

int lyb_parse_model(char *data,lys_module **mod,lyb_state *lybs)

{
  uint uVar1;
  int iVar2;
  lys_module *plVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  ly_ctx *plVar7;
  void *pvVar8;
  char *pcVar9;
  uint uVar10;
  char *__ptr;
  char local_53 [8];
  char mod_rev [11];
  char *local_40;
  char *mod_name;
  uint16_t rev;
  
  local_40 = (char *)0x0;
  uVar1 = lyb_read_string(data,&local_40,1,lybs);
  if (-1 < (int)uVar1) {
    iVar2 = lyb_read_number((void *)((long)&mod_name + 6),2,2,data + uVar1,lybs);
    if (-1 < iVar2) {
      uVar10 = (uint)mod_name._6_2_;
      mod_rev._3_8_ = mod;
      if (mod_name._6_2_ == 0) {
        plVar7 = lybs->ctx;
        pcVar5 = (char *)0x0;
      }
      else {
        sprintf(local_53,"%04u-%02u-%02u",(ulong)((mod_name._6_2_ >> 9) + 2000),
                (ulong)(mod_name._6_2_ >> 5 & 0xf),(ulong)(uVar10 & 0x1f));
        plVar7 = lybs->ctx;
        pcVar5 = local_53;
      }
      __ptr = local_40;
      plVar3 = ly_ctx_get_module(plVar7,local_40,pcVar5,0);
      *(lys_module **)mod_rev._3_8_ = plVar3;
      plVar7 = lybs->ctx;
      if (plVar7->data_clb == (ly_module_data_clb)0x0) {
LAB_00141142:
        if (plVar3 != (lys_module *)0x0) goto LAB_00141147;
        pcVar5 = "Invalid context for LYB data parsing, missing module \"%s%s%s\".";
      }
      else {
        if (plVar3 == (lys_module *)0x0) {
          pvVar8 = plVar7->data_clb_data;
          pcVar5 = (char *)0x0;
          iVar4 = 0;
LAB_00141138:
          plVar3 = (*plVar7->data_clb)(plVar7,__ptr,pcVar5,iVar4,pvVar8);
          *(lys_module **)mod_rev._3_8_ = plVar3;
          goto LAB_00141142;
        }
        if ((plVar3->field_0x40 & 0x80) == 0) {
          pcVar5 = plVar3->ns;
          pvVar8 = plVar7->data_clb_data;
          iVar4 = 1;
          goto LAB_00141138;
        }
LAB_00141147:
        if ((plVar3->field_0x40 & 0x80) != 0) {
          iVar2 = iVar2 + uVar1;
          goto LAB_0014119e;
        }
        pcVar5 = "Invalid context for LYB data parsing, module \"%s%s%s\" not implemented.";
      }
      pcVar9 = "@";
      if (uVar10 == 0) {
        pcVar9 = "";
      }
      pcVar6 = local_53;
      if (uVar10 == 0) {
        pcVar6 = "";
      }
      ly_log(lybs->ctx,LY_LLERR,LY_EINVAL,pcVar5,__ptr,pcVar9,pcVar6);
    }
  }
  iVar2 = -1;
  __ptr = local_40;
LAB_0014119e:
  free(__ptr);
  return iVar2;
}

Assistant:

static int
lyb_parse_model(const char *data, const struct lys_module **mod, struct lyb_state *lybs)
{
    int r, ret = 0;
    char *mod_name = NULL, mod_rev[11];
    uint16_t rev;

    /* model name */
    ret += (r = lyb_read_string(data, &mod_name, 1, lybs));
    LYB_HAVE_READ_GOTO(r, data, error);

    /* revision */
    ret += (r = lyb_read_number(&rev, sizeof rev, 2, data, lybs));
    LYB_HAVE_READ_GOTO(r, data, error);

    if (rev) {
        sprintf(mod_rev, "%04u-%02u-%02u", ((rev & 0xFE00) >> 9) + 2000, (rev & 0x01E0) >> 5, (rev & 0x001F));
        *mod = ly_ctx_get_module(lybs->ctx, mod_name, mod_rev, 0);
    } else {
        *mod = ly_ctx_get_module(lybs->ctx, mod_name, NULL, 0);
    }
    if (lybs->ctx->data_clb) {
        if (!*mod) {
            *mod = lybs->ctx->data_clb(lybs->ctx, mod_name, NULL, 0, lybs->ctx->data_clb_data);
        } else if (!(*mod)->implemented) {
            *mod = lybs->ctx->data_clb(lybs->ctx, mod_name, (*mod)->ns, LY_MODCLB_NOT_IMPLEMENTED, lybs->ctx->data_clb_data);
        }
    }

    if (!*mod) {
        LOGERR(lybs->ctx, LY_EINVAL, "Invalid context for LYB data parsing, missing module \"%s%s%s\".",
               mod_name, rev ? "@" : "", rev ? mod_rev : "");
        goto error;
    } else if (!(*mod)->implemented) {
        LOGERR(lybs->ctx, LY_EINVAL, "Invalid context for LYB data parsing, module \"%s%s%s\" not implemented.",
               mod_name, rev ? "@" : "", rev ? mod_rev : "");
        goto error;
    }

    free(mod_name);
    return ret;

error:
    free(mod_name);
    return -1;
}